

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsDef.cpp
# Opt level: O2

AmsNetId make_AmsNetId(string *addr)

{
  int iVar1;
  istream *piVar2;
  long lVar3;
  AmsNetId id;
  string s;
  istringstream iss;
  
  std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)addr,_S_in);
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  AmsNetId::AmsNetId(&id,0);
  for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&iss,(string *)&s,'.');
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) goto LAB_00122512;
    iVar1 = atoi(s._M_dataplus._M_p);
    id.b[lVar3] = (uint8_t)iVar1;
  }
  piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                     ((istream *)&iss,(string *)&s,'.');
  if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) {
LAB_00122512:
    stack0xfffffffffffffe3c = stack0xfffffffffffffe3c & 0xffff0000;
    id.b[0] = '\0';
    id.b[1] = '\0';
    id.b[2] = '\0';
    id.b[3] = '\0';
  }
  std::__cxx11::string::~string((string *)&s);
  std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
  return (uint8_t  [6])((uint6)stack0xfffffffffffffe3c << 0x20 | (uint6)(uint)id.b._0_4_);
}

Assistant:

AmsNetId make_AmsNetId(const std::string& addr)
{
    std::istringstream iss(addr);
    std::string s;
    size_t i = 0;
    AmsNetId id {};

    while ((i < sizeof(id.b)) && std::getline(iss, s, '.')) {
        id.b[i] = atoi(s.c_str()) % 256;
        ++i;
    }

    if ((i != sizeof(id.b)) || std::getline(iss, s, '.')) {
        memset(id.b, 0, sizeof(id.b));
    }
    return id;
}